

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void basic_test(service *srv,bool throws)

{
  int iVar1;
  string *psVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  url_mapper m;
  streamable local_408;
  ostringstream oss_1;
  char local_3d0 [360];
  streamable local_268;
  undefined4 local_248;
  undefined4 local_244;
  streamable local_240;
  undefined4 local_220;
  undefined4 local_21c;
  streamable local_218;
  ostringstream ss;
  undefined1 local_1e8 [360];
  undefined4 local_80;
  undefined4 local_7c;
  streamable local_78;
  application app;
  
  cppcms::application::application(&app,srv);
  cppcms::url_mapper::url_mapper(&m,&app);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Basic Mapping",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"foo","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/foo","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"foo","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/foo/{1}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"foo","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/foo/{1}/{2}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"foo","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/foo/{1}/{2}/{3}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"foo","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/foo/{1}/{2}/{3}/{4}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"foo","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/foo/{1}/{2}/{3}/{4}/{5}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"foo","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&oss_1,"/foo/{1}/{2}/{3}/{4}/{5}/{6}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"bar","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/bar/{lang}/{1}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"bar","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"/bar/{2}/{1}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"test1","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"{1}x","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"test2","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"x{1}","");
  cppcms::url_mapper::assign((string *)&m,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  psVar2 = (string *)cppcms::application::mapper();
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"lang","");
  _oss_1 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"en","");
  cppcms::url_mapper::set_value(psVar2,(string *)&ss);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  _ss = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"test.com","");
  cppcms::url_mapper::root((string *)&m);
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  cppcms::url_mapper::root_abi_cxx11_();
  iVar1 = std::__cxx11::string::compare((char *)&ss);
  if (_ss != local_1e8) {
    operator_delete(_ss);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&ss,0x160);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," m.root()==\"test.com\"",0x15);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&oss_1);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::url_mapper::map((ostream *)&m,(char *)&ss);
  value((string *)&oss_1,&ss);
  iVar1 = std::__cxx11::string::compare((char *)&oss_1);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_1,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x164);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," value(ss) == \"test.com/foo\"",0x1c)
    ;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_408);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_408.ptr_ = (void *)CONCAT44(local_408.ptr_._4_4_,1);
  cppcms::filters::streamable::set
            (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_408,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x13412d);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  iVar1 = std::__cxx11::string::compare((char *)&oss_1);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_1,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x168);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss) == \"test.com/foo/1\"",0x1e);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_408);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_268.ptr_._0_4_ = 1;
  cppcms::filters::streamable::set
            (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_268,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_240.ptr_._0_4_ = 2;
  cppcms::filters::streamable::set
            (&local_408,(_func_void_ostream_ptr_void_ptr *)&local_240,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x13412d,(streamable *)&oss_1);
  cppcms::filters::streamable::~streamable(&local_408);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  iVar1 = std::__cxx11::string::compare((char *)&oss_1);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_1,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x16a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss) == \"test.com/foo/1/2\"",0x20);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_408);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_240.ptr_._0_4_ = 1;
  cppcms::filters::streamable::set
            (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_240,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_218.ptr_._0_4_ = 2;
  cppcms::filters::streamable::set
            (&local_408,(_func_void_ostream_ptr_void_ptr *)&local_218,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_78.ptr_._0_4_ = 3;
  cppcms::filters::streamable::set
            (&local_268,(_func_void_ostream_ptr_void_ptr *)&local_78,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x13412d,(streamable *)&oss_1,&local_408);
  cppcms::filters::streamable::~streamable(&local_268);
  cppcms::filters::streamable::~streamable(&local_408);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  iVar1 = std::__cxx11::string::compare((char *)&oss_1);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_1,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x16c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss) == \"test.com/foo/1/2/3\"",0x22);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_408);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218.ptr_._0_4_ = 1;
  cppcms::filters::streamable::set
            (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_218,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_78.ptr_._0_4_ = 2;
  cppcms::filters::streamable::set
            (&local_408,(_func_void_ostream_ptr_void_ptr *)&local_78,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_244 = 3;
  cppcms::filters::streamable::set
            (&local_268,(_func_void_ostream_ptr_void_ptr *)&local_244,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_248 = 4;
  cppcms::filters::streamable::set
            (&local_240,(_func_void_ostream_ptr_void_ptr *)&local_248,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x13412d,(streamable *)&oss_1,&local_408,
             &local_268);
  cppcms::filters::streamable::~streamable(&local_240);
  cppcms::filters::streamable::~streamable(&local_268);
  cppcms::filters::streamable::~streamable(&local_408);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  iVar1 = std::__cxx11::string::compare((char *)&oss_1);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_1,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x16e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss) == \"test.com/foo/1/2/3/4\"",0x24);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_408);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_78.ptr_._0_4_ = 1;
  cppcms::filters::streamable::set
            (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_78,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_244 = 2;
  cppcms::filters::streamable::set
            (&local_408,(_func_void_ostream_ptr_void_ptr *)&local_244,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_248 = 3;
  cppcms::filters::streamable::set
            (&local_268,(_func_void_ostream_ptr_void_ptr *)&local_248,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_21c = 4;
  cppcms::filters::streamable::set
            (&local_240,(_func_void_ostream_ptr_void_ptr *)&local_21c,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_220 = 5;
  cppcms::filters::streamable::set
            (&local_218,(_func_void_ostream_ptr_void_ptr *)&local_220,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x13412d,(streamable *)&oss_1,&local_408,
             &local_268,&local_240);
  cppcms::filters::streamable::~streamable(&local_218);
  cppcms::filters::streamable::~streamable(&local_240);
  cppcms::filters::streamable::~streamable(&local_268);
  cppcms::filters::streamable::~streamable(&local_408);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  iVar1 = std::__cxx11::string::compare((char *)&oss_1);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_1,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x170);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss) == \"test.com/foo/1/2/3/4/5\"",0x26);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_408);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_244 = 1;
  cppcms::filters::streamable::set
            (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_244,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_248 = 2;
  cppcms::filters::streamable::set
            (&local_408,(_func_void_ostream_ptr_void_ptr *)&local_248,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_21c = 3;
  cppcms::filters::streamable::set
            (&local_268,(_func_void_ostream_ptr_void_ptr *)&local_21c,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_220 = 4;
  cppcms::filters::streamable::set
            (&local_240,(_func_void_ostream_ptr_void_ptr *)&local_220,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_7c = 5;
  cppcms::filters::streamable::set
            (&local_218,(_func_void_ostream_ptr_void_ptr *)&local_7c,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  local_80 = 6;
  cppcms::filters::streamable::set
            (&local_78,(_func_void_ostream_ptr_void_ptr *)&local_80,
             cppcms::filters::streamable::to_stream<int>,
             (type_info *)cppcms::filters::streamable::to_string<int>);
  cppcms::url_mapper::map
            ((ostream *)&m,(char *)&ss,(streamable *)0x13412d,(streamable *)&oss_1,&local_408,
             &local_268,&local_240,&local_218);
  cppcms::filters::streamable::~streamable(&local_78);
  cppcms::filters::streamable::~streamable(&local_218);
  cppcms::filters::streamable::~streamable(&local_240);
  cppcms::filters::streamable::~streamable(&local_268);
  cppcms::filters::streamable::~streamable(&local_408);
  cppcms::filters::streamable::~streamable((streamable *)&oss_1);
  value((string *)&oss_1,&ss);
  iVar1 = std::__cxx11::string::compare((char *)&oss_1);
  if (_oss_1 != local_3d0) {
    operator_delete(_oss_1);
  }
  if (iVar1 == 0) {
    local_218.ptr_._0_4_ = 1;
    cppcms::filters::streamable::set
              (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_218,
               cppcms::filters::streamable::to_stream<int>,
               (type_info *)cppcms::filters::streamable::to_string<int>);
    cppcms::filters::streamable::streamable(&local_408,"a");
    cppcms::filters::streamable::streamable(&local_268,"b");
    local_78.ptr_._0_4_ = 5;
    cppcms::filters::streamable::set
              (&local_240,(_func_void_ostream_ptr_void_ptr *)&local_78,
               cppcms::filters::streamable::to_stream<int>,
               (type_info *)cppcms::filters::streamable::to_string<int>);
    cppcms::url_mapper::map
              ((ostream *)&m,(char *)&ss,(streamable *)0x13412d,(streamable *)&oss_1,&local_408,
               &local_268);
    cppcms::filters::streamable::~streamable(&local_240);
    cppcms::filters::streamable::~streamable(&local_268);
    cppcms::filters::streamable::~streamable(&local_408);
    cppcms::filters::streamable::~streamable((streamable *)&oss_1);
    value((string *)&oss_1,&ss);
    iVar1 = std::__cxx11::string::compare((char *)&oss_1);
    if (_oss_1 != local_3d0) {
      operator_delete(_oss_1);
    }
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&oss_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x175);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," value(ss) == \"test.com/foo/1/a/b/5\"",0x24);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_408);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_408.ptr_ = (void *)CONCAT44(local_408.ptr_._4_4_,1);
    cppcms::filters::streamable::set
              (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_408,
               cppcms::filters::streamable::to_stream<int>,
               (type_info *)cppcms::filters::streamable::to_string<int>);
    cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x13362d);
    cppcms::filters::streamable::~streamable((streamable *)&oss_1);
    value((string *)&oss_1,&ss);
    iVar1 = std::__cxx11::string::compare((char *)&oss_1);
    if (_oss_1 != local_3d0) {
      operator_delete(_oss_1);
    }
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&oss_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x178);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," value(ss) == \"test.com/bar/en/1\"",0x21);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_408);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_268.ptr_._0_4_ = 1;
    cppcms::filters::streamable::set
              (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_268,
               cppcms::filters::streamable::to_stream<int>,
               (type_info *)cppcms::filters::streamable::to_string<int>);
    cppcms::filters::streamable::streamable(&local_408,"ru");
    cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)0x13362d,(streamable *)&oss_1);
    cppcms::filters::streamable::~streamable(&local_408);
    cppcms::filters::streamable::~streamable((streamable *)&oss_1);
    value((string *)&oss_1,&ss);
    iVar1 = std::__cxx11::string::compare((char *)&oss_1);
    if (_oss_1 != local_3d0) {
      operator_delete(_oss_1);
    }
    if (iVar1 == 0) {
      _oss_1 = local_3d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"");
      cppcms::url_mapper::root((string *)&m);
      if (_oss_1 != local_3d0) {
        operator_delete(_oss_1);
      }
      local_408.ptr_ = (void *)CONCAT44(local_408.ptr_._4_4_,10);
      cppcms::filters::streamable::set
                (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_408,
                 cppcms::filters::streamable::to_stream<int>,
                 (type_info *)cppcms::filters::streamable::to_string<int>);
      cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)"test1");
      cppcms::filters::streamable::~streamable((streamable *)&oss_1);
      value((string *)&oss_1,&ss);
      iVar1 = std::__cxx11::string::compare((char *)&oss_1);
      if (_oss_1 != local_3d0) {
        operator_delete(_oss_1);
      }
      if (iVar1 == 0) {
        local_408.ptr_ = (void *)CONCAT44(local_408.ptr_._4_4_,10);
        cppcms::filters::streamable::set
                  (&oss_1,(_func_void_ostream_ptr_void_ptr *)&local_408,
                   cppcms::filters::streamable::to_stream<int>,
                   (type_info *)cppcms::filters::streamable::to_string<int>);
        cppcms::url_mapper::map((ostream *)&m,(char *)&ss,(streamable *)"test2");
        cppcms::filters::streamable::~streamable((streamable *)&oss_1);
        value((string *)&oss_1,&ss);
        iVar1 = std::__cxx11::string::compare((char *)&oss_1);
        if (_oss_1 != local_3d0) {
          operator_delete(_oss_1);
        }
        if (iVar1 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"-- Testing throwing at invalid params",0x25);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          _oss_1 = local_3d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&oss_1,"x","");
          local_408.ptr_ = &local_408.to_string_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"a{","");
          cppcms::url_mapper::assign((string *)&m,(string *)&oss_1);
          if ((to_string_type *)local_408.ptr_ != &local_408.to_string_) {
            operator_delete(local_408.ptr_);
          }
          if (_oss_1 != local_3d0) {
            operator_delete(_oss_1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&oss_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                     ,0x62);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x184);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," 0",2);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar4,(string *)&local_408);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&oss_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x17f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," value(ss) == \"x10\"",0x13);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)&local_408);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&oss_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x17d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," value(ss) == \"10x\"",0x13);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_408);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_1,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x17a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," value(ss) == \"test.com/bar/ru/1\"",0x21);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_408);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&oss_1,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss_1,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&oss_1,0x172);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," value(ss) == \"test.com/foo/1/2/3/4/5/6\"",0x28);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&local_408);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void basic_test(cppcms::service &srv,bool throws)
{
	cppcms::application app(srv);
	cppcms::url_mapper m(&app);

	std::cout << "-- Basic Mapping" << std::endl;

	m.assign("foo","/foo");
	m.assign("foo","/foo/{1}");
	m.assign("foo","/foo/{1}/{2}");
	m.assign("foo","/foo/{1}/{2}/{3}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}/{5}");
	m.assign("foo","/foo/{1}/{2}/{3}/{4}/{5}/{6}");
	m.assign("bar","/bar/{lang}/{1}");
	m.assign("bar","/bar/{2}/{1}");
	m.assign("test1","{1}x");
	m.assign("test2","x{1}");
	app.mapper().set_value("lang","en");
	m.root("test.com");
	TEST(m.root()=="test.com");

	std::ostringstream ss;
	m.map(ss,"foo");
	TEST(value(ss) == "test.com/foo");


	m.map(ss,"foo",1);
	TEST(value(ss) == "test.com/foo/1");
	m.map(ss,"foo",1,2);
	TEST(value(ss) == "test.com/foo/1/2");
	m.map(ss,"foo",1,2,3);
	TEST(value(ss) == "test.com/foo/1/2/3");
	m.map(ss,"foo",1,2,3,4);
	TEST(value(ss) == "test.com/foo/1/2/3/4");
	m.map(ss,"foo",1,2,3,4,5);
	TEST(value(ss) == "test.com/foo/1/2/3/4/5");
	m.map(ss,"foo",1,2,3,4,5,6);
	TEST(value(ss) == "test.com/foo/1/2/3/4/5/6");

	m.map(ss,"foo",1,"a","b",5);
	TEST(value(ss) == "test.com/foo/1/a/b/5");
	
	m.map(ss,"bar",1);
	TEST(value(ss) == "test.com/bar/en/1");
	m.map(ss,"bar",1,"ru");
	TEST(value(ss) == "test.com/bar/ru/1");
	m.root("");
	m.map(ss,"test1",10);
	TEST(value(ss) == "10x");
	m.map(ss,"test2",10);
	TEST(value(ss) == "x10");

	std::cout << "-- Testing throwing at invalid params" << std::endl;
	try {
		m.assign("x","a{");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }

	try {
		m.assign("x","a}");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }
	
	try {
		m.assign("x","a{0}");
		TEST(0);
	}
	catch(cppcms::cppcms_error const &e) {}
	catch(...) { TEST(0); }

	if(throws) {
		try {
			m.map(ss,"undefined");
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
		
		try {
			m.map(ss,"undefined");
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
		
		try {
			m.map(ss,"test1",1,2);
			TEST(!"Should not be there");
		}
		catch(cppcms::cppcms_error const &e) {}
	}
	else {

		m.map(ss,"undefined");
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");

		m.map(ss,"undefined");
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");

		m.map(ss,"test1",1,2);
		TEST(value(ss)=="/this_is_an_invalid_url_generated_by_url_mapper");
	}
}